

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::ServiceDescriptor::GetLocationPath
          (ServiceDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  int __c;
  vector<int,_std::allocator<int>_> *in_RSI;
  char *__s;
  ServiceDescriptor *in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffe0;
  char local_14 [4];
  vector<int,_std::allocator<int>_> *local_10;
  
  local_14[0] = '\x06';
  local_14[1] = '\0';
  local_14[2] = '\0';
  local_14[3] = '\0';
  __s = local_14;
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffffe0,(value_type_conflict2 *)in_RDI);
  index(in_RDI,__s,__c);
  std::vector<int,_std::allocator<int>_>::push_back(local_10,(value_type_conflict2 *)in_RDI);
  return;
}

Assistant:

void ServiceDescriptor::GetLocationPath(std::vector<int>* output) const {
  output->push_back(FileDescriptorProto::kServiceFieldNumber);
  output->push_back(index());
}